

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::Pubkey::GetFingerprint(ByteData *__return_storage_ptr__,Pubkey *this,uint32_t get_size)

{
  undefined8 uVar1;
  bool bVar2;
  CfdException *this_00;
  ByteData160 data160;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  uint32_t local_7c;
  Pubkey local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_7c = get_size;
  if (0xffffffeb < get_size - 0x15) {
    ByteData::ByteData((ByteData *)local_58);
    bVar2 = IsCompress(this);
    if (bVar2) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    }
    else {
      Compress(&local_78,this);
      uVar1 = local_58._0_8_;
      local_58._0_8_ =
           local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_58._8_8_ =
           local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48._M_allocated_capacity =
           (size_type)
           local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1);
        if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
    HashUtil::Hash160((ByteData160 *)&local_78,(ByteData *)local_58);
    ByteData160::GetBytes(&local_38,(ByteData160 *)&local_78);
    ByteData::ByteData(__return_storage_ptr__,
                       local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,get_size);
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_);
    }
    return __return_storage_ptr__;
  }
  local_58._0_8_ = "cfdcore_key.cpp";
  local_58._8_4_ = 0x51;
  local_48._M_allocated_capacity = 0x5d711f;
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"Invalid fingerprint size: {}.",
             &local_7c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = &local_48;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Invalid fingerprint size.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Pubkey::GetFingerprint(uint32_t get_size) const {
  if ((get_size == 0) || (get_size > kByteData160Length)) {
    warn(CFD_LOG_SOURCE, "Invalid fingerprint size: {}.", get_size);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid fingerprint size.");
  }

  ByteData data;
  if (IsCompress()) {
    data = data_;
  } else {
    data = Compress().data_;
  }
  auto data160 = HashUtil::Hash160(data);
  auto bytes = data160.GetBytes();
  return ByteData(bytes.data(), get_size);
}